

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O1

void wall_extends(level *lev,int x1,int y1,int x2,int y2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  schar *psVar17;
  ulong uVar18;
  int iVar19;
  byte local_64;
  byte local_60;
  schar *local_50;
  
  if ((((0x4f < x2 || x1 < 0) || (y2 < y1)) || (y1 < 0)) || ((x2 < x1 || (0x14 < y2)))) {
    panic("wall_extends: bad bounds (%d,%d) to (%d,%d)",(ulong)(uint)x1,(ulong)(uint)y1,
          (ulong)(uint)x2,(ulong)(uint)y2);
  }
  if (x1 <= x2) {
    uVar15 = (ulong)x1;
    local_50 = &lev->locations[uVar15 + 1][(long)y1 + 1].typ;
    do {
      if (y1 <= y2) {
        uVar1 = uVar15 - 1;
        uVar12 = (int)uVar15 - 2;
        psVar17 = local_50;
        uVar18 = (long)y1;
        iVar19 = (y2 - y1) + 1;
        do {
          if ((byte)(psVar17[-0x108] - 1U) < 0xb) {
            uVar2 = uVar18 - 1;
            if ((uVar2 < 0x15 && uVar12 < 0x4f) && (bVar8 = psVar17[-0x210], '\f' < (char)bVar8)) {
              local_60 = 1;
              if (bVar8 < 0x18) {
                local_60 = (byte)(0x3f7fff >> (bVar8 & 0x1f));
              }
            }
            else {
              local_60 = 0;
            }
            if ((0x4e < uVar1 || 0x14 < uVar2) || (bVar8 = psVar17[-0x114], (char)bVar8 < '\r')) {
              bVar7 = 0;
            }
            else {
              bVar7 = 1;
              if (bVar8 < 0x18) {
                bVar7 = (byte)(0x3f7fff >> (bVar8 & 0x1f));
              }
            }
            if ((uVar15 < 0x4f && uVar2 < 0x15) && (bVar8 = psVar17[-0x18], '\f' < (char)bVar8)) {
              bVar9 = 1;
              if (bVar8 < 0x18) {
                bVar9 = (byte)(0x3f7fff >> (bVar8 & 0x1f));
              }
            }
            else {
              bVar9 = 0;
            }
            if ((0x14 < uVar18 || 0x4e < uVar12) || (bVar8 = psVar17[-0x204], (char)bVar8 < '\r')) {
              bVar13 = 0;
            }
            else {
              bVar13 = 1;
              if (bVar8 < 0x18) {
                bVar13 = (byte)(0x3f7fff >> (bVar8 & 0x1f));
              }
            }
            if ((0x4e < uVar15 || 0x14 < uVar18) || (bVar8 = psVar17[-0xc], (char)bVar8 < '\r')) {
              bVar5 = 0;
            }
            else {
              bVar5 = 1;
              if (bVar8 < 0x18) {
                bVar5 = (byte)(0x3f7fff >> (bVar8 & 0x1f));
              }
            }
            uVar3 = uVar18 + 1;
            if ((uVar3 < 0x15 && uVar12 < 0x4f) && (bVar8 = psVar17[-0x1f8], '\f' < (char)bVar8)) {
              bVar14 = 1;
              if (bVar8 < 0x18) {
                bVar14 = (byte)(0x3f7fff >> (bVar8 & 0x1f));
              }
            }
            else {
              bVar14 = 0;
            }
            if ((0x4e < uVar1 || 0x14 < uVar3) || (bVar8 = psVar17[-0xfc], (char)bVar8 < '\r')) {
              local_64 = 0;
            }
            else {
              local_64 = 1;
              if (bVar8 < 0x18) {
                local_64 = (byte)(0x3f7fff >> (bVar8 & 0x1f));
              }
            }
            bVar8 = 0;
            if (uVar15 < 0x4f && uVar3 < 0x15) {
              bVar4 = *psVar17;
              if ((char)bVar4 < '\r') {
                bVar8 = 0;
              }
              else {
                bVar8 = 1;
                if (bVar4 < 0x18) {
                  bVar8 = (byte)(0x3f7fff >> (bVar4 & 0x1f));
                }
              }
            }
            uVar16 = 0;
            if ((0x4e >= uVar1 && 0x14 >= uVar2) &&
               ((bVar4 = psVar17[-0x114], bVar4 != 0 && (char)bVar4 < '\r' ||
                ((uVar16 = 0, bVar4 < 0x18 && ((0xc08000U >> (bVar4 & 0x1f) & 1) != 0)))))) {
              uVar16 = ((byte)(bVar9 | local_60 | bVar13 | bVar5) & 1) << 3;
            }
            uVar6 = 0;
            uVar10 = 0;
            if (0x4e >= uVar1 && 0x14 >= uVar3) {
              bVar4 = psVar17[-0xfc];
              if (bVar4 == 0 || '\f' < (char)bVar4) {
                uVar10 = 0;
                if ((0x17 < bVar4) || (uVar10 = 0, (0xc08000U >> (bVar4 & 0x1f) & 1) == 0))
                goto LAB_001dbf9e;
              }
              uVar10 = ((byte)(bVar14 | bVar8 | bVar13 | bVar5) & 1) << 2;
            }
LAB_001dbf9e:
            if ((0x4e >= uVar15 && 0x14 >= uVar18) &&
               ((bVar13 = psVar17[-0xc], bVar13 != 0 && (char)bVar13 < '\r' ||
                ((uVar6 = 0, bVar13 < 0x18 && ((0xc08000U >> (bVar13 & 0x1f) & 1) != 0)))))) {
              uVar6 = ((byte)(bVar9 | bVar8 | bVar7 | local_64) & 1) * 2;
            }
            uVar11 = 0;
            if ((0x14 >= uVar18 && 0x4e >= uVar12) &&
               ((bVar8 = psVar17[-0x204], bVar8 != 0 && (char)bVar8 < '\r' ||
                ((uVar11 = 0, bVar8 < 0x18 && (uVar11 = 0, (0xc08000U >> (bVar8 & 0x1f) & 1) != 0)))
                ))) {
              uVar11 = (byte)(bVar14 | local_60 | bVar7 | local_64) & 1;
            }
            uVar11 = uVar10 | uVar16 | uVar6 | uVar11;
            if (uVar11 != 0) {
              psVar17[-0x108] = "\x01\x02\x02\x02\x01\x04\x03\t\x01\x06\x05\b\x01\n\v\a"[uVar11];
            }
          }
          uVar18 = uVar18 + 1;
          psVar17 = psVar17 + 0xc;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      uVar15 = uVar15 + 1;
      local_50 = local_50 + 0xfc;
    } while (x2 + 1 != (int)uVar15);
  }
  return;
}

Assistant:

void wall_extends(struct level *lev, int x1, int y1, int x2, int y2)
{
	uchar type;
	int x, y;
	struct rm *loc;
	int bits;
	int locale[3][3];	/* rock or wall status surrounding positions */
	/*
	 * Value 0 represents a free-standing wall.  It could be anything,
	 * so even though this table says VWALL, we actually leave whatever
	 * typ was there alone.
	 */
	static const xchar spine_array[16] = {
	    VWALL,	HWALL,		HWALL,		HWALL,
	    VWALL,	TRCORNER,	TLCORNER,	TDWALL,
	    VWALL,	BRCORNER,	BLCORNER,	TUWALL,
	    VWALL,	TLWALL,		TRWALL,		CROSSWALL
	};

	/* sanity check on incoming variables */
	if (x1 < 0 || x2 >= COLNO || x1 > x2 || y1 < 0 || y2 >= ROWNO || y1 > y2)
	    panic("wall_extends: bad bounds (%d,%d) to (%d,%d)", x1, y1, x2, y2);

	for (x = x1; x <= x2; x++)
	    for (y = y1; y <= y2; y++) {
		loc = &lev->locations[x][y];
		type = loc->typ;
		if ( !(IS_WALL(type) && type != DBWALL)) continue;

		/* set the locations TRUE if rock or wall or out of bounds */
		locale[0][0] = iswall_or_stone(lev, x-1, y-1);
		locale[1][0] = iswall_or_stone(lev,   x, y-1);
		locale[2][0] = iswall_or_stone(lev, x+1, y-1);

		locale[0][1] = iswall_or_stone(lev, x-1,   y);
		locale[2][1] = iswall_or_stone(lev, x+1,   y);

		locale[0][2] = iswall_or_stone(lev, x-1, y+1);
		locale[1][2] = iswall_or_stone(lev,   x, y+1);
		locale[2][2] = iswall_or_stone(lev, x+1, y+1);

		/* determine if wall should extend to each direction NSEW */
		bits =    (extend_spine(locale, iswall(lev, x,y-1),  0, -1) << 3)
			| (extend_spine(locale, iswall(lev, x,y+1),  0,  1) << 2)
			| (extend_spine(locale, iswall(lev, x+1,y),  1,  0) << 1)
			|  extend_spine(locale, iswall(lev, x-1,y), -1,  0);

		/* don't change typ if wall is free-standing */
		if (bits) loc->typ = spine_array[bits];
	    }
}